

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O0

bool __thiscall
MT32Emu::Partial::doProduceOutput<short,MT32Emu::LA32IntPartialPair>
          (Partial *this,short *leftBuf,short *rightBuf,Bit32u length,
          LA32IntPartialPair *la32PairImpl)

{
  bool bVar1;
  LA32IntPartialPair *la32PairImpl_local;
  short *psStack_28;
  Bit32u length_local;
  short *rightBuf_local;
  short *leftBuf_local;
  Partial *this_local;
  
  psStack_28 = rightBuf;
  rightBuf_local = leftBuf;
  leftBuf_local = (short *)this;
  bVar1 = canProduceOutput(this);
  if (bVar1) {
    this->alreadyOutputed = true;
    this->sampleNum = 0;
    while ((this->sampleNum < length &&
           (bVar1 = generateNextSample<MT32Emu::LA32IntPartialPair>(this,la32PairImpl), bVar1))) {
      produceAndMixSample(this,&rightBuf_local,&stack0xffffffffffffffd8,la32PairImpl);
      this->sampleNum = this->sampleNum + 1;
    }
    this->sampleNum = 0;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Partial::doProduceOutput(Sample *leftBuf, Sample *rightBuf, Bit32u length, LA32PairImpl *la32PairImpl) {
	if (!canProduceOutput()) return false;
	alreadyOutputed = true;

	for (sampleNum = 0; sampleNum < length; sampleNum++) {
		if (!generateNextSample(la32PairImpl)) break;
		produceAndMixSample(leftBuf, rightBuf, la32PairImpl);
	}
	sampleNum = 0;
	return true;
}